

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O2

int xmrig::NvmlLib::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RAX;
  undefined7 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  
  if (m_initialized == '\x01') {
    uVar2 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),m_ready);
  }
  else {
    String::copy((String *)&m_loader,ctx,in_RDX);
    bVar1 = dlopen();
    if (bVar1) {
      bVar1 = load();
      uVar2 = (uint)CONCAT71(extraout_var,bVar1);
    }
    else {
      uVar2 = 0;
    }
    m_ready = (undefined1)uVar2;
    m_initialized = '\x01';
  }
  return uVar2 & 0xffffff01;
}

Assistant:

bool xmrig::NvmlLib::init(const char *fileName)
{
    if (!m_initialized) {
        m_loader      = fileName;
        m_ready       = dlopen() && load();
        m_initialized = true;
    }

    return m_ready;
}